

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

void wwRepW(word *a,size_t n,word w)

{
  bool bVar1;
  
  if (n != 0) {
    while (bVar1 = n != 0, n = n - 1, bVar1) {
      a[n] = w;
    }
  }
  return;
}

Assistant:

void wwRepW(word a[], size_t n, register word w)
{
	ASSERT(wwIsValid(a, n));
	if (n)
		for (; n--; a[n] = w);
	else
		ASSERT(w == 0);
	w = 0;
}